

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O2

void __thiscall xray_re::xr_scene_lights::save_v12(xr_scene_lights *this,xr_ini_writer *w)

{
  size_t in_RCX;
  size_t __n;
  void *__buf;
  
  xr_ini_writer::open_section(w,"lcontrols");
  xr_ini_writer::
  w_ini_seq<std::vector<xray_re::xr_token,std::allocator<xray_re::xr_token>>,write_ini_token>
            (w,&this->m_controls);
  xr_ini_writer::close_section(w);
  xr_ini_writer::open_section(w,"main");
  xr_ini_writer::write(w,0x1c66ca,(void *)(ulong)this->m_flags,in_RCX);
  __n = 0x28;
  xr_ini_writer::write
            (w,0x1d1e01,
             (void *)(((long)(this->m_controls).
                             super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_controls).
                            super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28),0x28);
  xr_ini_writer::write
            (w,0x1d19dd,
             (void *)((long)(this->super_xr_scene_objects).m_objects.
                            super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_xr_scene_objects).m_objects.
                            super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3),__n);
  xr_ini_writer::write(w,0x1d1e13,__buf,__n);
  xr_ini_writer::write(w,0x1d3f45,(void *)0x0,__n);
  xr_ini_writer::close_section(w);
  xr_scene::write_revision((this->super_xr_scene_objects).super_xr_scene_part.m_scene,w,true);
  xr_scene_objects::save_v12(&this->super_xr_scene_objects,w);
  return;
}

Assistant:

void xr_scene_lights::save_v12(xr_ini_writer* w) const
{
	w->open_section("lcontrols");
	w->w_ini_seq(m_controls, write_ini_token());
	w->close_section();

	w->open_section("main");
	w->write("flags", this->m_flags);
	w->write("lcontrol_last_idx", this->m_controls.size());
	w->write("objects_count", this->objects().size());
	w->write("sun_shadow_dir", this->m_sun);
	w->write("version", 0);
	w->close_section();

	scene().write_revision(w);

	xr_scene_objects::save_v12(w);
}